

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForInObjectEnumerator.cpp
# Opt level: O0

RecyclableObject *
Js::ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
          (RecyclableObject *object,RecyclableObject **pFirstPrototype)

{
  code *pcVar1;
  RecyclableObject *pRVar2;
  bool bVar3;
  TypeId TVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  DynamicObject *this;
  RecyclableObject *local_48;
  RecyclableObject *firstPrototypeWithEnumerableProperties;
  RecyclableObject *firstPrototype;
  RecyclableObject **pFirstPrototype_local;
  RecyclableObject *object_local;
  TypeId typeId_1;
  TypeId typeId;
  
  firstPrototypeWithEnumerableProperties = (RecyclableObject *)0x0;
  local_48 = (RecyclableObject *)0x0;
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  TVar4 = RecyclableObject::GetTypeId(object);
  if ((0x57 < (int)TVar4) && (BVar5 = RecyclableObject::IsExternal(object), BVar5 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pRVar2 = object;
  if (TVar4 != TypeIds_HostDispatch) {
    do {
      local_48 = pRVar2;
      local_48 = RecyclableObject::GetPrototype(local_48);
      if (local_48 == (RecyclableObject *)0x0) break;
      if (local_48 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      TVar4 = RecyclableObject::GetTypeId(local_48);
      if ((0x57 < (int)TVar4) && (BVar5 = RecyclableObject::IsExternal(local_48), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      if (TVar4 == TypeIds_Null) {
        local_48 = (RecyclableObject *)0x0;
        break;
      }
      if (firstPrototypeWithEnumerableProperties == (RecyclableObject *)0x0) {
        firstPrototypeWithEnumerableProperties = local_48;
      }
      TVar4 = RecyclableObject::GetTypeId(local_48);
      bVar3 = DynamicType::Is(TVar4);
      if (!bVar3) break;
      this = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(local_48);
      bVar3 = DynamicObject::GetHasNoEnumerableProperties(this);
      pRVar2 = local_48;
    } while (bVar3);
  }
  if (pFirstPrototype != (RecyclableObject **)0x0) {
    *pFirstPrototype = firstPrototypeWithEnumerableProperties;
  }
  return local_48;
}

Assistant:

RecyclableObject* ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(RecyclableObject* object, RecyclableObject** pFirstPrototype)
    {
        RecyclableObject* firstPrototype = nullptr;
        RecyclableObject* firstPrototypeWithEnumerableProperties = nullptr;

        if (JavascriptOperators::GetTypeId(object) != TypeIds_HostDispatch)
        {
            firstPrototypeWithEnumerableProperties = object;
            while (true)
            {
                firstPrototypeWithEnumerableProperties = firstPrototypeWithEnumerableProperties->GetPrototype();

                if (firstPrototypeWithEnumerableProperties == nullptr)
                {
                    break;
                }

                if (JavascriptOperators::GetTypeId(firstPrototypeWithEnumerableProperties) == TypeIds_Null)
                {
                    firstPrototypeWithEnumerableProperties = nullptr;
                    break;
                }

                if (firstPrototype == nullptr)
                {
                    firstPrototype = firstPrototypeWithEnumerableProperties;
                }

                if (!DynamicType::Is(firstPrototypeWithEnumerableProperties->GetTypeId())
                    || !UnsafeVarTo<DynamicObject>(firstPrototypeWithEnumerableProperties)->GetHasNoEnumerableProperties())
                {
                    break;
                }
            }
        }

        if (pFirstPrototype != nullptr)
        {
            *pFirstPrototype = firstPrototype;
        }

        return firstPrototypeWithEnumerableProperties;
    }